

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O1

void __thiscall
charls::jls_codec<charls::lossless_traits<unsigned_short,_16>,_charls::decoder_strategy>::
initialize_parameters
          (jls_codec<charls::lossless_traits<unsigned_short,_16>,_charls::decoder_strategy> *this,
          int32_t t1,int32_t t2,int32_t t3,int32_t reset_threshold)

{
  undefined8 *puVar1;
  long lVar2;
  
  this->t1_ = t1;
  this->t2_ = t2;
  this->t3_ = t3;
  this->reset_threshold_ = (uint8_t)reset_threshold;
  initialize_quantization_lut(this);
  lVar2 = 0x9c;
  do {
    puVar1 = (undefined8 *)((long)this + lVar2 + -0xc);
    *puVar1 = 0x400;
    puVar1[1] = 0x100000000;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x176c);
  (this->context_run_mode_)._M_elems[0].run_interruption_type_ = 0;
  (this->context_run_mode_)._M_elems[0].a_ = 0x400;
  (this->context_run_mode_)._M_elems[0].n_ = '\x01';
  (this->context_run_mode_)._M_elems[0].nn_ = '\0';
  (this->context_run_mode_)._M_elems[1].run_interruption_type_ = 1;
  (this->context_run_mode_)._M_elems[1].a_ = 0x400;
  (this->context_run_mode_)._M_elems[1].n_ = '\x01';
  (this->context_run_mode_)._M_elems[1].nn_ = '\0';
  this->run_index_ = 0;
  return;
}

Assistant:

void initialize_parameters(const int32_t t1, const int32_t t2, const int32_t t3, const int32_t reset_threshold)
    {
        t1_ = t1;
        t2_ = t2;
        t3_ = t3;
        reset_threshold_ = static_cast<uint8_t>(reset_threshold);

        initialize_quantization_lut();
        reset_parameters();
    }